

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::
SparseMatrix<(iDynTree::MatrixStorageOrdering)1>
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,
          SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *other)

{
  size_t sVar1;
  _func_int **pp_Var2;
  Triplets *this_00;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *in_RSI;
  VectorDynSize *in_RDI;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *in_stack_00000018;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  Triplets *in_stack_00000030;
  Triplets oldTriplets;
  size_t in_stack_ffffffffffffff78;
  
  VectorDynSize::VectorDynSize(in_RDI);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7750c1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7750d4);
  in_RDI[2].m_size = 0;
  sVar1 = iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::rows(in_RSI);
  in_RDI[2].m_capacity = sVar1;
  pp_Var2 = (_func_int **)
            iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::columns(in_RSI);
  in_RDI[3]._vptr_VectorDynSize = pp_Var2;
  Triplets::Triplets((Triplets *)0x77513e);
  this_00 = (Triplets *)
            iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::numberOfNonZeros
                      ((SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *)0x775148);
  Triplets::reserve(this_00,in_stack_ffffffffffffff78);
  Triplets::addSubMatrix<(iDynTree::MatrixStorageOrdering)1>
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  setFromTriplets((SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *)
                  oldTriplets.m_triplets.
                  super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                  (Triplets *)
                  oldTriplets.m_triplets.
                  super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  Triplets::~Triplets((Triplets *)0x775193);
  return;
}

Assistant:

SparseMatrix<iDynTree::RowMajor>::SparseMatrix(const SparseMatrix<iDynTree::ColumnMajor>& other)
    : m_allocatedSize(0)
    , m_rows(other.rows())
    , m_columns(other.columns())
    {
        iDynTree::Triplets oldTriplets;
        oldTriplets.reserve(other.numberOfNonZeros());
        oldTriplets.addSubMatrix(0, 0, other);

        setFromTriplets(oldTriplets);
    }